

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall Js::StepController::Deactivate(StepController *this,InterpreterHaltState *haltState)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *pFVar3;
  undefined4 *puVar4;
  Recycler *recycler;
  InterpreterHaltState *haltState_local;
  StepController *this_local;
  
  if (((haltState == (InterpreterHaltState *)0x0) || (haltState->stopType != STOP_STEPCOMPLETE)) ||
     ((this->stepType == STEP_IN && (0 < this->returnedValueRecordingDepth)))) {
    ResetReturnedValueList(this);
  }
  pFVar3 = Memory::RecyclerRootPtr::operator_cast_to_FunctionBody_((RecyclerRootPtr *)&this->body);
  if (pFVar3 != (FunctionBody *)0x0) {
    if (this->pActivatedContext == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                  ,0xd0,"(this->pActivatedContext)","this->pActivatedContext");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    recycler = ScriptContext::GetRecycler(this->pActivatedContext);
    Memory::RecyclerRootPtr<Js::FunctionBody>::Unroot(&this->body,recycler);
  }
  this->pActivatedContext = (ScriptContext *)0x0;
  this->stepType = STEP_NONE;
  this->byteOffset = -1;
  this->statementMap = (StatementMap *)0x0;
  this->frameCountWhenSet = 0;
  this->scriptIdWhenSet = 0xffffffff;
  this->frameAddrWhenSet = 0xffffffffffffffff;
  return;
}

Assistant:

void StepController::Deactivate(InterpreterHaltState* haltState /*=nullptr*/)
    {
        // If we are deactivating the step controller during ProbeContainer close or attach/detach we should clear return value list
        // If we break other than step -> clear the list.
        // If we step in and we land on different function (we are in recording phase the current function) -> clear the list
        if ((haltState == nullptr) || (haltState->stopType != Js::STOP_STEPCOMPLETE || (this->stepType == STEP_IN && this->returnedValueRecordingDepth > 0)))
        {
            ResetReturnedValueList();
        }

        if (this->body)
        {
            Assert(this->pActivatedContext);
            this->body.Unroot(this->pActivatedContext->GetRecycler());
        }
        this->pActivatedContext = NULL;
        stepType = STEP_NONE;
        byteOffset = Js::Constants::NoByteCodeOffset;
        statementMap = NULL;

        frameCountWhenSet = 0;
        scriptIdWhenSet = InvalidScriptId;
        frameAddrWhenSet = (size_t)-1;
    }